

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O3

void __thiscall
TPZSYsmpMatrix<long_double>::AddKel
          (TPZSYsmpMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  longdouble *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST2;
  longdouble lVar14;
  longdouble in_ST3;
  longdouble lVar15;
  longdouble in_ST4;
  longdouble in_ST5;
  
  lVar7 = (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (0 < lVar7) {
    lVar10 = 0;
    lVar5 = 0;
    do {
      if (0 < lVar7) {
        lVar9 = 0;
        lVar13 = in_ST0;
        lVar11 = in_ST1;
        lVar12 = in_ST2;
        lVar14 = in_ST3;
        lVar15 = in_ST4;
        do {
          lVar7 = destinationindex->fStore[lVar10];
          lVar1 = destinationindex->fStore[lVar9];
          in_ST0 = lVar13;
          in_ST1 = lVar11;
          in_ST2 = lVar12;
          in_ST3 = lVar14;
          in_ST4 = lVar15;
          if ((lVar7 <= lVar1) &&
             ((*(elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(elmat,lVar10,lVar9), in_ST0 = lVar11, in_ST1 = lVar12,
             in_ST2 = lVar14, in_ST3 = lVar15, in_ST4 = in_ST5, (longdouble)1e-16 <= ABS(lVar13))) {
            lVar8 = lVar5 + 1;
            plVar2 = (this->fIA).fStore;
            lVar3 = plVar2[lVar7];
            lVar7 = plVar2[lVar7 + 1];
            if ((lVar8 < lVar3) || ((lVar7 <= lVar8 || ((this->fJA).fStore[lVar5 + 1] != lVar1)))) {
              lVar5 = lVar3;
              if (lVar3 < lVar7) {
                plVar2 = (this->fJA).fStore;
                lVar8 = lVar3 * 8;
                do {
                  lVar5 = *(long *)((long)plVar2 + lVar8);
                  if (lVar5 == lVar1) {
                    if (lVar1 == -1) goto LAB_00cd2530;
                    plVar6 = (this->fA).fStore;
                    lVar13 = *(longdouble *)((long)plVar6 + lVar8 * 2) + lVar13;
LAB_00cd253c:
                    *(longdouble *)((long)plVar6 + lVar8 * 2) = lVar13;
                    lVar5 = lVar3;
                    goto LAB_00cd2544;
                  }
                  if (lVar5 == -1) {
LAB_00cd2530:
                    *(long *)((long)plVar2 + lVar8) = lVar1;
                    plVar6 = (this->fA).fStore;
                    goto LAB_00cd253c;
                  }
                  lVar3 = lVar3 + 1;
                  lVar8 = lVar8 + 8;
                  lVar5 = lVar7;
                } while (lVar7 != lVar3);
              }
              lVar13 = in_ST5;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line =",
                         0x46);
              poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," column =",9);
              poVar4 = std::ostream::_M_insert<long>((long)poVar4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              in_ST0 = lVar11;
              in_ST1 = lVar12;
              in_ST2 = lVar14;
              in_ST3 = lVar15;
              in_ST4 = in_ST5;
              in_ST5 = lVar13;
            }
            else {
              plVar6 = (this->fA).fStore;
              plVar6[lVar8] = plVar6[lVar8] + lVar13;
              lVar5 = lVar8;
            }
          }
LAB_00cd2544:
          lVar9 = lVar9 + 1;
          lVar7 = (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          lVar13 = in_ST0;
          lVar11 = in_ST1;
          lVar12 = in_ST2;
          lVar14 = in_ST3;
          lVar15 = in_ST4;
        } while (lVar9 < lVar7);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lVar7);
  }
  return;
}

Assistant:

void TPZSYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            if(jpos<ipos) continue;
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) std::cout << "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << std::endl;         }
        }
    }
}